

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O1

list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> * __thiscall
udpdiscovery::impl::PeerEnv::ListDiscovered_abi_cxx11_
          (list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
           *__return_storage_ptr__,PeerEnv *this)

{
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *plVar1;
  
  (__return_storage_ptr__->
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>).
  _M_impl._M_node._M_size = 0;
  pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  plVar1 = &this->discovered_peers_;
  if (plVar1 != __return_storage_ptr__) {
    std::__cxx11::list<udpdiscovery::DiscoveredPeer,std::allocator<udpdiscovery::DiscoveredPeer>>::
    _M_assign_dispatch<std::_List_const_iterator<udpdiscovery::DiscoveredPeer>>
              ((list<udpdiscovery::DiscoveredPeer,std::allocator<udpdiscovery::DiscoveredPeer>> *)
               __return_storage_ptr__,
               (plVar1->
               super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
               )._M_impl._M_node.super__List_node_base._M_next,plVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  return __return_storage_ptr__;
}

Assistant:

std::list<DiscoveredPeer> ListDiscovered() {
    std::list<DiscoveredPeer> result;

    lock_.Lock();
    result = discovered_peers_;
    lock_.Unlock();

    return result;
  }